

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocker.cc
# Opt level: O1

void __thiscall
webrtc::Blocker::ProcessChunk
          (Blocker *this,float **input,size_t chunk_size,size_t num_input_channels,
          size_t num_output_channels,float **output)

{
  ChannelBuffer<float> *pCVar1;
  float *pfVar2;
  size_t sVar3;
  size_t sVar4;
  float *pfVar5;
  BlockerCallback *pBVar6;
  float *pfVar7;
  ChannelBuffer<float> *pCVar8;
  AudioRingBuffer *this_00;
  string *result;
  float **ppfVar9;
  float **ppfVar10;
  float **ppfVar11;
  size_t sVar12;
  int line;
  size_t sVar13;
  ChannelBuffer<float> *t;
  ChannelBuffer<float> *t_8;
  ChannelBuffer<float> *t_3;
  ChannelBuffer<float> *t_5;
  ChannelBuffer<float> *t_2;
  size_t local_1f0;
  ulong local_1e8;
  size_t local_1e0;
  size_t local_1d8;
  ChannelBuffer<float> *local_1d0;
  Blocker *local_1c8;
  ChannelBuffer<float> *local_1c0;
  float **local_1b8;
  AudioRingBuffer *local_1b0;
  FatalMessage local_1a8;
  
  local_1f0 = num_input_channels;
  local_1e0 = num_output_channels;
  local_1d8 = chunk_size;
  if (this->chunk_size_ == chunk_size) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_1d8,&this->chunk_size_,"chunk_size == chunk_size_");
  }
  if (result == (string *)0x0) {
    if (local_1f0 == this->num_input_channels_) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         (&local_1f0,&this->num_input_channels_,
                          "num_input_channels == num_input_channels_");
    }
    if (result == (string *)0x0) {
      if (local_1e0 == this->num_output_channels_) {
        result = (string *)0x0;
      }
      else {
        result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                           (&local_1e0,&this->num_output_channels_,
                            "num_output_channels == num_output_channels_");
      }
      if (result == (string *)0x0) {
        local_1b0 = &this->input_buffer_;
        AudioRingBuffer::Write(local_1b0,input,local_1f0,this->chunk_size_);
        local_1e8 = this->frame_offset_;
        if (local_1e8 < this->chunk_size_) {
          local_1c0 = &this->input_block_;
          pCVar1 = &this->output_block_;
          local_1d0 = &this->output_buffer_;
          local_1c8 = this;
          local_1b8 = output;
          do {
            pCVar8 = local_1c0;
            ppfVar9 = ChannelBuffer<float>::channels(local_1c0,0);
            this_00 = local_1b0;
            AudioRingBuffer::Read(local_1b0,ppfVar9,local_1f0,this->block_size_);
            AudioRingBuffer::MoveReadPositionBackward
                      (this_00,this->block_size_ - this->shift_amount_);
            pfVar2 = (this->window_)._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl;
            sVar3 = this->block_size_;
            sVar4 = this->num_input_channels_;
            ppfVar9 = ChannelBuffer<float>::channels(pCVar8,0);
            if (sVar4 != 0) {
              sVar12 = 0;
              do {
                if (sVar3 != 0) {
                  pfVar5 = ppfVar9[sVar12];
                  sVar13 = 0;
                  do {
                    pfVar5[sVar13] = pfVar5[sVar13] * pfVar2[sVar13];
                    sVar13 = sVar13 + 1;
                  } while (sVar3 != sVar13);
                }
                sVar12 = sVar12 + 1;
              } while (sVar12 != sVar4);
            }
            pBVar6 = this->callback_;
            ppfVar9 = ChannelBuffer<float>::channels(pCVar8,0);
            sVar3 = this->block_size_;
            sVar4 = this->num_input_channels_;
            sVar12 = this->num_output_channels_;
            ChannelBuffer<float>::channels(pCVar1,0);
            (*pBVar6->_vptr_BlockerCallback[2])(pBVar6,ppfVar9,sVar3,sVar4,sVar12);
            pfVar2 = (this->window_)._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl;
            sVar3 = this->block_size_;
            sVar4 = this->num_output_channels_;
            ppfVar9 = ChannelBuffer<float>::channels(pCVar1,0);
            pCVar8 = local_1d0;
            if (sVar4 != 0) {
              sVar12 = 0;
              do {
                if (sVar3 != 0) {
                  pfVar5 = ppfVar9[sVar12];
                  sVar13 = 0;
                  do {
                    pfVar5[sVar13] = pfVar5[sVar13] * pfVar2[sVar13];
                    sVar13 = sVar13 + 1;
                  } while (sVar3 != sVar13);
                }
                sVar12 = sVar12 + 1;
              } while (sVar12 != sVar4);
            }
            ppfVar9 = ChannelBuffer<float>::channels(local_1d0,0);
            ppfVar10 = ChannelBuffer<float>::channels(pCVar1,0);
            this = local_1c8;
            sVar3 = local_1c8->block_size_;
            sVar4 = local_1c8->num_output_channels_;
            ppfVar11 = ChannelBuffer<float>::channels(pCVar8,0);
            if (sVar4 != 0) {
              sVar12 = 0;
              do {
                if (sVar3 != 0) {
                  pfVar2 = ppfVar9[sVar12];
                  pfVar5 = ppfVar10[sVar12];
                  pfVar7 = ppfVar11[sVar12];
                  sVar13 = 0;
                  do {
                    pfVar7[local_1e8 + sVar13] = pfVar2[local_1e8 + sVar13] + pfVar5[sVar13];
                    sVar13 = sVar13 + 1;
                  } while (sVar3 != sVar13);
                }
                sVar12 = sVar12 + 1;
              } while (sVar12 != sVar4);
            }
            local_1e8 = local_1e8 + this->shift_amount_;
            output = local_1b8;
          } while (local_1e8 < this->chunk_size_);
        }
        pCVar1 = &this->output_buffer_;
        ppfVar9 = ChannelBuffer<float>::channels(pCVar1,0);
        sVar3 = this->num_output_channels_;
        if (sVar3 != 0) {
          sVar4 = this->chunk_size_;
          sVar12 = 0;
          do {
            memcpy(output[sVar12],ppfVar9[sVar12],sVar4 << 2);
            sVar12 = sVar12 + 1;
          } while (sVar3 != sVar12);
        }
        ppfVar9 = ChannelBuffer<float>::channels(pCVar1,0);
        sVar12 = local_1d8;
        sVar3 = this->num_output_channels_;
        sVar4 = this->initial_delay_;
        ppfVar10 = ChannelBuffer<float>::channels(pCVar1,0);
        if (sVar3 != 0) {
          sVar13 = 0;
          do {
            memmove(ppfVar10[sVar13],ppfVar9[sVar13] + sVar12,sVar4 << 2);
            sVar13 = sVar13 + 1;
          } while (sVar3 != sVar13);
        }
        ppfVar9 = ChannelBuffer<float>::channels(pCVar1,0);
        sVar3 = this->num_output_channels_;
        if (sVar3 != 0) {
          sVar4 = this->initial_delay_;
          sVar12 = this->chunk_size_;
          sVar13 = 0;
          do {
            memset(ppfVar9[sVar13] + sVar4,0,sVar12 << 2);
            sVar13 = sVar13 + 1;
          } while (sVar3 != sVar13);
        }
        this->frame_offset_ = local_1e8 - this->chunk_size_;
        return;
      }
      line = 0xae;
    }
    else {
      line = 0xad;
    }
  }
  else {
    line = 0xac;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/blocker.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void Blocker::ProcessChunk(const float* const* input,
                           size_t chunk_size,
                           size_t num_input_channels,
                           size_t num_output_channels,
                           float* const* output) {
  RTC_CHECK_EQ(chunk_size, chunk_size_);
  RTC_CHECK_EQ(num_input_channels, num_input_channels_);
  RTC_CHECK_EQ(num_output_channels, num_output_channels_);

  input_buffer_.Write(input, num_input_channels, chunk_size_);
  size_t first_frame_in_block = frame_offset_;

  // Loop through blocks.
  while (first_frame_in_block < chunk_size_) {
    input_buffer_.Read(input_block_.channels(), num_input_channels,
                       block_size_);
    input_buffer_.MoveReadPositionBackward(block_size_ - shift_amount_);

    ApplyWindow(window_.get(),
                block_size_,
                num_input_channels_,
                input_block_.channels());
    callback_->ProcessBlock(input_block_.channels(),
                            block_size_,
                            num_input_channels_,
                            num_output_channels_,
                            output_block_.channels());
    ApplyWindow(window_.get(),
                block_size_,
                num_output_channels_,
                output_block_.channels());

    AddFrames(output_buffer_.channels(),
              first_frame_in_block,
              output_block_.channels(),
              0,
              block_size_,
              num_output_channels_,
              output_buffer_.channels(),
              first_frame_in_block);

    first_frame_in_block += shift_amount_;
  }

  // Copy output buffer to output
  CopyFrames(output_buffer_.channels(),
             0,
             chunk_size_,
             num_output_channels_,
             output,
             0);

  // Copy output buffer [chunk_size_, chunk_size_ + initial_delay]
  // to output buffer [0, initial_delay], zero the rest.
  MoveFrames(output_buffer_.channels(),
             chunk_size,
             initial_delay_,
             num_output_channels_,
             output_buffer_.channels(),
             0);
  ZeroOut(output_buffer_.channels(),
          initial_delay_,
          chunk_size_,
          num_output_channels_);

  // Calculate new starting frames.
  frame_offset_ = first_frame_in_block - chunk_size_;
}